

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O3

void psh_globals_destroy(PSH_Globals globals)

{
  FT_Memory memory;
  
  if (globals != (PSH_Globals)0x0) {
    memory = globals->memory;
    globals->dimension[0].stdw.count = 0;
    globals->dimension[1].stdw.count = 0;
    (globals->blues).normal_top.count = 0;
    (globals->blues).normal_bottom.count = 0;
    (globals->blues).family_top.count = 0;
    (globals->blues).family_bottom.count = 0;
    ft_mem_free(memory,globals);
    return;
  }
  return;
}

Assistant:

static void
  psh_globals_destroy( PSH_Globals  globals )
  {
    if ( globals )
    {
      FT_Memory  memory;


      memory = globals->memory;
      globals->dimension[0].stdw.count = 0;
      globals->dimension[1].stdw.count = 0;

      globals->blues.normal_top.count    = 0;
      globals->blues.normal_bottom.count = 0;
      globals->blues.family_top.count    = 0;
      globals->blues.family_bottom.count = 0;

      FT_FREE( globals );

#ifdef DEBUG_HINTER
      ps_debug_globals = NULL;
#endif
    }
  }